

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_get_array_item(qpdf_data qpdf,qpdf_oh oh,int n)

{
  uint uVar1;
  anon_class_16_2_fd2a75f8 local_68;
  function<unsigned_int_(QPDFObjectHandle_&)> local_58;
  function<unsigned_int_()> local_38;
  int local_18;
  qpdf_oh local_14;
  int n_local;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_18 = n;
  local_14 = oh;
  _n_local = qpdf;
  return_null(&local_38,qpdf);
  local_68.qpdf = _n_local;
  local_68.n = local_18;
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_get_array_item::__0,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_58,&local_68);
  uVar1 = do_with_oh<unsigned_int>(qpdf,oh,&local_38,&local_58);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_58);
  std::function<unsigned_int_()>::~function(&local_38);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_get_array_item(qpdf_data qpdf, qpdf_oh oh, int n)
{
    return do_with_oh<qpdf_oh>(qpdf, oh, return_null(qpdf), [qpdf, n](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_array_item");
        return new_object(qpdf, o.getArrayItem(n));
    });
}